

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::_ClearNodes(SQTable *this)

{
  SQObjectPtr *in_RDI;
  _HashNode *n;
  SQInteger i;
  long local_10;
  
  for (local_10 = 0; local_10 < in_RDI[4].super_SQObject._unVal.nInteger; local_10 = local_10 + 1) {
    ::SQObjectPtr::Null(in_RDI);
    ::SQObjectPtr::Null(in_RDI);
  }
  return;
}

Assistant:

void SQTable::_ClearNodes()
{
    for(SQInteger i = 0;i < _numofnodes; i++) { _HashNode &n = _nodes[i]; n.key.Null(); n.val.Null(); }
}